

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

APInt __thiscall llvm::detail::DoubleAPFloat::bitcastToAPInt(DoubleAPFloat *this)

{
  undefined8 extraout_RDX;
  long *in_RSI;
  APFloat *pAVar1;
  Significand SVar2;
  APInt AVar3;
  uint64_t Data [2];
  Significand local_48;
  uint local_40;
  integerPart local_38;
  undefined8 local_30;
  APFloat *local_28;
  undefined4 local_20;
  
  if ((undefined1 *)*in_RSI == semPPCDoubleDouble) {
    APFloat::bitcastToAPInt((APFloat *)&local_48);
    SVar2.parts = (integerPart *)&local_48;
    if (0x40 < local_40) {
      SVar2 = local_48;
    }
    local_38 = *SVar2.parts;
    APFloat::bitcastToAPInt((APFloat *)&local_28);
    pAVar1 = (APFloat *)&local_28;
    if (0x40 < (uint)local_20) {
      pAVar1 = local_28;
    }
    local_30 = *(undefined8 *)pAVar1;
    if (local_28 != (APFloat *)0x0 && 0x40 < (uint)local_20) {
      operator_delete__(local_28);
    }
    if ((0x40 < local_40) && ((undefined8 *)local_48.part != (undefined8 *)0x0)) {
      operator_delete__(local_48.parts);
    }
    APInt::APInt((APInt *)this,0x80,2,&local_38);
    AVar3._8_8_ = extraout_RDX;
    AVar3.U.pVal = (uint64_t *)this;
    return AVar3;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x10b2,"APInt llvm::detail::DoubleAPFloat::bitcastToAPInt() const");
}

Assistant:

APInt DoubleAPFloat::bitcastToAPInt() const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  uint64_t Data[] = {
      Floats[0].bitcastToAPInt().getRawData()[0],
      Floats[1].bitcastToAPInt().getRawData()[0],
  };
  return APInt(128, 2, Data);
}